

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O3

void spvOptimizerSetMessageConsumer(spv_optimizer_t *optimizer,spv_message_consumer consumer)

{
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/optimizer.cpp:1219:11)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/optimizer.cpp:1219:11)>
             ::_M_manager;
  local_28._M_unused._0_8_ = (undefined8)consumer;
  spvtools::Optimizer::SetMessageConsumer((Optimizer *)optimizer,(MessageConsumer *)&local_28);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return;
}

Assistant:

SPIRV_TOOLS_EXPORT void spvOptimizerSetMessageConsumer(
    spv_optimizer_t* optimizer, spv_message_consumer consumer) {
  reinterpret_cast<spvtools::Optimizer*>(optimizer)->
      SetMessageConsumer(
          [consumer](spv_message_level_t level, const char* source,
                     const spv_position_t& position, const char* message) {
            return consumer(level, source, &position, message);
          });
}